

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_promise_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue val_03;
  JSValue obj;
  void *pvVar1;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSPromiseReactionData *rd;
  int i;
  list_head *el;
  JSPromiseData *s;
  JS_MarkFunc *in_stack_ffffffffffffffb8;
  JSRuntime *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  JSRuntime *in_stack_ffffffffffffffd0;
  JSRuntime *pJVar3;
  
  obj.tag = in_RDX;
  obj.u.float64 = in_RSI.float64;
  pvVar1 = JS_GetOpaque(obj,0x2a);
  if (pvVar1 != (void *)0x0) {
    for (iVar2 = 0; iVar2 < 2; iVar2 = iVar2 + 1) {
      in_stack_ffffffffffffffd0 = *(JSRuntime **)((long)pvVar1 + (long)iVar2 * 0x10 + 0x10);
      while (in_stack_ffffffffffffffd0 != (JSRuntime *)((long)pvVar1 + (long)iVar2 * 0x10 + 8)) {
        val_00.u._4_4_ = iVar2;
        val_00.u.int32 = in_stack_ffffffffffffffc8;
        val_00.tag = (int64_t)in_stack_ffffffffffffffd0;
        pJVar3 = in_stack_ffffffffffffffd0;
        JS_MarkValue(in_stack_ffffffffffffffd0,val_00,in_stack_ffffffffffffffb8);
        val_01.u._4_4_ = iVar2;
        val_01.u.int32 = in_stack_ffffffffffffffc8;
        val_01.tag = (int64_t)pJVar3;
        JS_MarkValue(in_stack_ffffffffffffffd0,val_01,in_stack_ffffffffffffffb8);
        val_02.u._4_4_ = iVar2;
        val_02.u.int32 = in_stack_ffffffffffffffc8;
        val_02.tag = (int64_t)pJVar3;
        JS_MarkValue(in_stack_ffffffffffffffd0,val_02,in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffd0;
        in_stack_ffffffffffffffd0 = (JSRuntime *)(pJVar3->mf).js_free;
      }
    }
    val_03.u._4_4_ = iVar2;
    val_03.u.int32 = in_stack_ffffffffffffffc8;
    val_03.tag = (int64_t)in_stack_ffffffffffffffd0;
    JS_MarkValue(in_stack_ffffffffffffffc0,val_03,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

static void js_promise_mark(JSRuntime *rt, JSValueConst val,
                            JS_MarkFunc *mark_func)
{
    JSPromiseData *s = JS_GetOpaque(val, JS_CLASS_PROMISE);
    struct list_head *el;
    int i;

    if (!s)
        return;
    for(i = 0; i < 2; i++) {
        list_for_each(el, &s->promise_reactions[i]) {
            JSPromiseReactionData *rd =
                list_entry(el, JSPromiseReactionData, link);
            JS_MarkValue(rt, rd->resolving_funcs[0], mark_func);
            JS_MarkValue(rt, rd->resolving_funcs[1], mark_func);
            JS_MarkValue(rt, rd->handler, mark_func);
        }
    }
    JS_MarkValue(rt, s->promise_result, mark_func);
}